

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cod_node.c
# Opt level: O1

sm_list cod_copy_list(sm_list list)

{
  sm_list plVar1;
  sm_ref psVar2;
  sm_list plVar3;
  
  if (list == (sm_list)0x0) {
    plVar1 = (sm_list)0x0;
  }
  else {
    plVar1 = (sm_list)malloc(0x10);
    psVar2 = cod_copy(list->node);
    plVar1->node = psVar2;
    plVar3 = cod_copy_list(list->next);
    plVar1->next = plVar3;
  }
  return plVar1;
}

Assistant:

extern sm_list cod_copy_list(sm_list list)
{
    sm_list new_list = NULL;
    if (list != NULL) {
        new_list = malloc(sizeof(*new_list));
        new_list->node = cod_copy(list->node);
        new_list->next = cod_copy_list(list->next);
    }
    return new_list;
}